

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

slist * gen_load_absoffsetrel
                  (compiler_state_t *cstate,bpf_abs_offset *abs_offset,u_int offset,u_int size)

{
  slist *psVar1;
  slist *s0;
  
  psVar1 = gen_abs_offset_varpart(cstate,abs_offset);
  if (psVar1 == (slist *)0x0) {
    psVar1 = new_stmt(cstate,size | 0x20);
    (psVar1->s).k = offset + abs_offset->constant_part;
  }
  else {
    s0 = new_stmt(cstate,size | 0x40);
    (s0->s).k = offset + abs_offset->constant_part;
    sappend(s0,s0);
  }
  return psVar1;
}

Assistant:

static struct slist *
gen_load_absoffsetrel(compiler_state_t *cstate, bpf_abs_offset *abs_offset,
    u_int offset, u_int size)
{
	struct slist *s, *s2;

	s = gen_abs_offset_varpart(cstate, abs_offset);

	/*
	 * If "s" is non-null, it has code to arrange that the X register
	 * contains the variable part of the absolute offset, so we
	 * generate a load relative to that, with an offset of
	 * abs_offset->constant_part + offset.
	 *
	 * Otherwise, we can do an absolute load with an offset of
	 * abs_offset->constant_part + offset.
	 */
	if (s != NULL) {
		/*
		 * "s" points to a list of statements that puts the
		 * variable part of the absolute offset into the X register.
		 * Do an indirect load, to use the X register as an offset.
		 */
		s2 = new_stmt(cstate, BPF_LD|BPF_IND|size);
		s2->s.k = abs_offset->constant_part + offset;
		sappend(s, s2);
	} else {
		/*
		 * There is no variable part of the absolute offset, so
		 * just do an absolute load.
		 */
		s = new_stmt(cstate, BPF_LD|BPF_ABS|size);
		s->s.k = abs_offset->constant_part + offset;
	}
	return s;
}